

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::TextureViewTestReferenceCounting::iterate(TextureViewTestReferenceCounting *this)

{
  ostringstream *this_00;
  GLuint *pGVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  pointer p_Var6;
  long lVar7;
  long lVar8;
  TestError *this_01;
  NotSupportedError *this_02;
  int line;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  GLuint *pGVar12;
  GLuint local_1e8 [4];
  GLuint *local_1d8;
  GLuint *local_1d0;
  GLuint *local_1c8;
  ulong local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_texture_view");
  if (!bVar2) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"GL_ARB_texture_view is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  (**(code **)(lVar5 + 8))(0x84c0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x27a2);
  (**(code **)(lVar5 + 0x1680))(this->m_po_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x27a6);
  local_1d0 = &this->m_view_view_to_id;
  local_1d8 = &this->m_view_to_id;
  local_1c8 = &this->m_parent_to_id;
  local_1c0 = 0;
  do {
    local_1e8[2] = 0;
    local_1e8[1] = 0;
    if ((int)local_1c0 == 2) {
      local_1e8[0] = *local_1d0;
    }
    else if ((int)local_1c0 == 1) {
      local_1e8[0] = (GLuint)*(undefined8 *)local_1d8;
      local_1e8[1] = (GLuint)((ulong)*(undefined8 *)local_1d8 >> 0x20);
    }
    else {
      local_1e8[0] = *local_1c8;
      local_1e8[1] = (GLuint)*(undefined8 *)local_1d8;
      local_1e8[2] = (GLuint)((ulong)*(undefined8 *)local_1d8 >> 0x20);
    }
    lVar7 = 0;
    do {
      if (local_1e8[lVar7] != 0) {
        local_1b8 = lVar7;
        (**(code **)(lVar5 + 0xb8))(0xde1);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glBindTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x27e3);
        (**(code **)(lVar5 + 0x30))(0);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glBeginTransformFeedback() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x27e7);
        p_Var6 = (this->m_mipmap_colors).
                 super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->m_mipmap_colors).
            super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
            ._M_impl.super__Vector_impl_data._M_finish != p_Var6) {
          uVar11 = 0;
          do {
            (**(code **)(lVar5 + 0x15a0))
                      ((float)p_Var6[uVar11].rgba[0] / 255.0,(float)p_Var6[uVar11].rgba[1] / 255.0,
                       (float)p_Var6[uVar11].rgba[2] / 255.0,(float)p_Var6[uVar11].rgba[3] / 255.0,
                       this->m_po_expected_texel_uniform_location);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar4,"glUniform4f() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x27f3);
            (**(code **)(lVar5 + 0x14f0))(this->m_po_lod_uniform_location,uVar11);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar4,"glUniform1i() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x27f6);
            (**(code **)(lVar5 + 0x538))(0,0,1);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar4,"glDrawArrays() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x27fb);
            uVar11 = (ulong)((int)uVar11 + 1);
            p_Var6 = (this->m_mipmap_colors).
                     super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar11 < (ulong)((long)(this->m_mipmap_colors).
                                          super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var6
                                   >> 2));
        }
        (**(code **)(lVar5 + 0x638))();
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glEndTransformFeedback() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x2800);
        lVar7 = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glMapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x2808);
        if (lVar7 == 0) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Pointer to mapped buffer object storage is NULL.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x280c);
          goto LAB_00a327e0;
        }
        lVar8 = (long)(this->m_mipmap_colors).
                      super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_mipmap_colors).
                      super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (lVar8 != 0) {
          uVar11 = 1;
          uVar10 = 0;
          do {
            uVar9 = uVar11;
            if (*(int *)(lVar7 + uVar10 * 4) != 1) {
              (**(code **)(lVar5 + 0x1670))(0x8c8e);
              local_1b0._0_8_ =
                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Invalid data was sampled for mip-map level [",0x2c);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"] and iteration [",0x11);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,"Mip-map sampling failed.",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x281b);
              goto LAB_00a327e0;
            }
            uVar11 = (ulong)((int)uVar9 + 1);
            uVar10 = uVar9;
          } while (uVar9 < (ulong)(lVar8 >> 2));
        }
        (**(code **)(lVar5 + 0x1670))(0x8c8e);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x2821);
        lVar7 = local_1b8;
      }
      pGVar12 = local_1c8;
      pGVar1 = local_1d8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    iVar3 = (int)local_1c0;
    if (iVar3 == 0) {
      (**(code **)(lVar5 + 0x480))(1,local_1c8);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      line = 0x282c;
    }
    else {
      if (iVar3 != 1) {
        if (iVar3 == 2) {
          (**(code **)(lVar5 + 0x480))(1,local_1d0);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glDeleteTextures() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x283e);
          this->m_view_view_to_id = 0;
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          return STOP;
        }
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid iteration index",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x2845);
LAB_00a327e0:
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar5 + 0x480))(1,local_1d8);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      line = 0x2835;
      pGVar12 = pGVar1;
    }
    glu::checkError(dVar4,"glDeleteTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,line);
    *pGVar12 = 0;
    local_1c0 = (ulong)(iVar3 + 1);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestReferenceCounting::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Carry on only if GL_ARB_texture_view extension is supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_view"))
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported");
	}

	/* Initialize all GL objects used for the test */
	initTest();

	/* Make sure texture unit 0 is currently active */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	/* Activate the test program object */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Run the test in three iterations:
	 *
	 * - Sample both the texture and all the views; once that's finished
	 *   successfully, delete the parent texture.
	 * - Sample both views; once that's finished successfully, delete
	 *   the first of the views;
	 * - Sample the only remaining view and make sure all mip-maps store
	 *   valid colors.
	 **/
	for (unsigned int n_iteration = 0; n_iteration < 3; /* iterations in total */
		 n_iteration++)
	{
		glw::GLuint to_ids_to_sample[3] = { 0, 0, 0 };

		/* Configure IDs of textures we need to validate for current iteration */
		switch (n_iteration)
		{
		case 0:
		{
			to_ids_to_sample[0] = m_parent_to_id;
			to_ids_to_sample[1] = m_view_to_id;
			to_ids_to_sample[2] = m_view_view_to_id;

			break;
		}

		case 1:
		{
			to_ids_to_sample[0] = m_view_to_id;
			to_ids_to_sample[1] = m_view_view_to_id;

			break;
		}

		case 2:
		{
			to_ids_to_sample[0] = m_view_view_to_id;

			break;
		}

		default:
			TCU_FAIL("Invalid iteration index");
		} /* switch (n_iteration) */

		/* Iterate through all texture objects of our concern */
		for (unsigned int n_texture = 0; n_texture < sizeof(to_ids_to_sample) / sizeof(to_ids_to_sample[0]);
			 n_texture++)
		{
			glw::GLint to_id = to_ids_to_sample[n_texture];

			if (to_id == 0)
			{
				/* No texture object to sample from. */
				continue;
			}

			/* Bind the texture object of our interest to GL_TEXTURE_2D */
			gl.bindTexture(GL_TEXTURE_2D, to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			/* Start XFB */
			gl.beginTransformFeedback(GL_POINTS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

			/* Iterate through all mip-maps of the texture we're currently sampling */
			for (unsigned int n_mipmap = 0; n_mipmap < m_mipmap_colors.size(); ++n_mipmap)
			{
				const _norm_vec4& expected_mipmap_color = m_mipmap_colors[n_mipmap];

				/* Update uniforms first */
				gl.uniform4f(m_po_expected_texel_uniform_location, (float)(expected_mipmap_color.rgba[0]) / 255.0f,
							 (float)(expected_mipmap_color.rgba[1]) / 255.0f,
							 (float)(expected_mipmap_color.rgba[2]) / 255.0f,
							 (float)(expected_mipmap_color.rgba[3]) / 255.0f);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4f() call failed.");

				gl.uniform1i(m_po_lod_uniform_location, n_mipmap);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

				/* Draw a single point. That'll feed the XFB buffer object with a single bool
				 * indicating if the test passed for the mip-map, or not */
				gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
			} /* for (all mip-maps) */

			/* We're done - close XFB */
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

			/* How did the sampling go? Map the buffer object containing the run
			 * results into process space.
			 */
			const glw::GLint* run_results_ptr =
				(const glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

			if (run_results_ptr == NULL)
			{
				TCU_FAIL("Pointer to mapped buffer object storage is NULL.");
			}

			/* Make sure all mip-maps were sampled successfully */
			for (unsigned int n_mipmap = 0; n_mipmap < m_mipmap_colors.size(); ++n_mipmap)
			{
				if (run_results_ptr[n_mipmap] != 1)
				{
					/* Make sure the TF BO is unmapped before we throw the exception */
					gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled for mip-map level ["
									   << n_mipmap << "] and iteration [" << n_iteration << "]"
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Mip-map sampling failed.");
				}
			} /* for (all mip-maps) */

			/* Good to unmap the buffer object at this point */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (all initialized texture objects) */

		/* Now that we're done with the iteration, we should delete iteration-specific texture
		 * object.
		 */
		switch (n_iteration)
		{
		case 0:
		{
			gl.deleteTextures(1, &m_parent_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");

			m_parent_to_id = 0;
			break;
		}

		case 1:
		{
			gl.deleteTextures(1, &m_view_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");

			m_view_to_id = 0;
			break;
		}

		case 2:
		{
			gl.deleteTextures(1, &m_view_view_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");

			m_view_view_to_id = 0;
			break;
		}

		default:
			TCU_FAIL("Invalid iteration index");
		} /* switch (n_iteration) */
	}	 /* for (all iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}